

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *
Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::zero(void)

{
  int iVar1;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_RDI;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_ffffffffffffffb0;
  Numeral *in_stack_ffffffffffffffb8;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_ffffffffffffffc0;
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_ffffffffffffffd0;
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_ffffffffffffffd8;
  
  if (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>::zero()::p == '\0') {
    iVar1 = __cxa_guard_acquire(&Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>::zero()::p);
    if (iVar1 != 0) {
      IntegerConstantType::IntegerConstantType
                (&in_stack_ffffffffffffffb0->numeral,in_stack_ffffffffffffffac);
      MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>::MonomFactors
                (in_stack_ffffffffffffffd0);
      Lib::
      perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>
                (in_stack_ffffffffffffffd8);
      Monom(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
            (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
             *)in_stack_ffffffffffffffb0);
      MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~MonomFactors
                ((MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x376c30);
      IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x376c3a);
      __cxa_atexit(~Monom,&zero::p,&__dso_handle);
      __cxa_guard_release(&Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>::zero()::p);
    }
  }
  Monom(in_stack_ffffffffffffffb0,
        (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  return in_RDI;
}

Assistant:

Monom<Number> Monom<Number>::zero() 
{ 
  static Monom p = Monom(Numeral(0), perfect(MonomFactors<Number>()));
  ASS(p.isZeroConst()) 
  return p; 
}